

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

int ntoh_cmp(void *a,void *b)

{
  int iVar1;
  EGameType EVar2;
  int iVar3;
  
  EVar2 = (EGameType)*(byte *)(*a + 300);
  iVar1 = (uint)((gameinfo.gametype & EVar2) == GAME_Any) * 2;
  if (EVar2 == GAME_Any) {
    iVar1 = 1;
  }
  EVar2 = (EGameType)*(byte *)(*b + 300);
  iVar3 = (uint)((gameinfo.gametype & EVar2) == GAME_Any) * 2;
  if (EVar2 == GAME_Any) {
    iVar3 = 1;
  }
  if (iVar1 - iVar3 == 0) {
    iVar1 = strcasecmp(FName::NameData.NameArray[*(int *)(*a + 0xa0)].Text,
                       FName::NameData.NameArray[*(int *)(*b + 0xa0)].Text);
    return iVar1;
  }
  return iVar1 - iVar3;
}

Assistant:

static int ntoh_cmp(const void *a, const void *b)
{
	PClassWeapon *c1 = *(PClassWeapon **)a;
	PClassWeapon *c2 = *(PClassWeapon **)b;
	int g1 = c1->GameFilter == GAME_Any ? 1 : (c1->GameFilter & gameinfo.gametype) ? 0 : 2;
	int g2 = c2->GameFilter == GAME_Any ? 1 : (c2->GameFilter & gameinfo.gametype) ? 0 : 2;
	if (g1 != g2)
	{
		return g1 - g2;
	}
	return stricmp(c1->TypeName.GetChars(), c2->TypeName.GetChars());
}